

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O2

void __thiscall wasm::AvoidReinterprets::visitUnary(AvoidReinterprets *this,Unary *curr)

{
  LocalGet *get;
  mapped_type *pmVar1;
  key_type local_18;
  Load *load;
  
  local_18 = (key_type)(ulong)curr->op;
  if ((((local_18 < (key_type)0x2f) && ((0x600600000000U >> ((ulong)local_18 & 0x3f) & 1) != 0)) &&
      (get = (LocalGet *)
             Properties::getFallthrough
                       (curr->value,
                        &((this->
                          super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                          ).super_Pass.runner)->options,
                        (this->
                        super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                        ).
                        super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                        .
                        super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                        .currModule,AllowTeeBrIf),
      (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id == LocalGetId))
     && (local_18 = getSingleLoad(this->localGraph,get,
                                  &((this->
                                    super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                                    ).super_Pass.runner)->options,
                                  (this->
                                  super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                                  .
                                  super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                                  .currModule), local_18 != (Load *)0x0)) {
    pmVar1 = std::
             map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
             ::operator[](&this->infos,&local_18);
    pmVar1->reinterpreted = true;
  }
  return;
}

Assistant:

static bool isReinterpret(Unary* curr) {
  return curr->op == ReinterpretInt32 || curr->op == ReinterpretInt64 ||
         curr->op == ReinterpretFloat32 || curr->op == ReinterpretFloat64;
}